

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

uint32_t event_track::get_meta_header_bytes
                   (uint32_t track_id,uint32_t timescale,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *header_bytes,bool is_vtt)

{
  _Ios_Openmode _Var1;
  size_type sVar2;
  undefined1 auVar3 [16];
  value_type_conflict3 local_1e9;
  undefined1 local_1e8 [16];
  value_type_conflict3 local_1d1;
  fpos afStack_1d0 [7];
  char c;
  undefined8 local_1c8;
  size_type local_1c0;
  uint64_t length;
  stringstream local_1a8 [8];
  stringstream ot;
  ostream local_198 [383];
  byte local_19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  bool is_vtt_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *header_bytes_local;
  uint32_t timescale_local;
  uint32_t track_id_local;
  
  local_19 = is_vtt;
  pvStack_18 = header_bytes;
  header_bytes_local._0_4_ = timescale;
  header_bytes_local._4_4_ = track_id;
  _Var1 = std::operator|(_S_out,_S_in);
  _Var1 = std::operator|(_Var1,_S_bin);
  std::__cxx11::stringstream::stringstream(local_1a8,_Var1);
  if ((local_19 & 1) == 0) {
    write_event_track_cmaf_header(header_bytes_local._4_4_,(uint32_t)header_bytes_local,local_198);
  }
  else {
    write_vtt_track_cmaf_header(header_bytes_local._4_4_,(uint32_t)header_bytes_local,local_198);
  }
  std::istream::seekg((long)local_1a8,_S_beg);
  _afStack_1d0 = std::istream::tellg();
  local_1c0 = std::fpos::operator_cast_to_long(afStack_1d0);
  std::istream::seekg((long)local_1a8,_S_beg);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(pvStack_18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(pvStack_18,local_1c0);
  while( true ) {
    auVar3 = std::istream::tellg();
    local_1e8 = auVar3;
    sVar2 = std::fpos::operator_cast_to_long((fpos *)local_1e8);
    if (sVar2 == local_1c0) break;
    local_1e9 = std::istream::get();
    local_1d1 = local_1e9;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvStack_18,&local_1e9);
  }
  sVar2 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvStack_18);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return (uint32_t)sVar2;
}

Assistant:

uint32_t event_track::get_meta_header_bytes(
	uint32_t track_id,
	uint32_t timescale,
	std::vector<uint8_t>& header_bytes,
	bool is_vtt)
{
	std::stringstream ot(
		std::stringstream::out | \
		std::stringstream::in | \
		std::stringstream::binary\
	);
	if (is_vtt)
		event_track::write_vtt_track_cmaf_header(track_id, timescale, ot);
	else
	    event_track::write_event_track_cmaf_header(track_id, timescale, ot);

	ot.seekg(0, ot.end);
	uint64_t length = ot.tellg();
	ot.seekg(0, ot.beg);
	header_bytes.clear();
	header_bytes.reserve(length);

	char c;
	while (ot.tellg() != length)
	{
		c = ot.get();
		header_bytes.push_back((uint8_t)c);
	}

	return (uint32_t)header_bytes.size();
}